

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3IncrmergeHintPush(Blob *pHint,i64 iAbsLevel,int nInput,int *pRc)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  blobGrowBuffer(pHint,pHint->n + 0x14,pRc);
  if (*pRc == 0) {
    iVar1 = pHint->n;
    pcVar2 = pHint->a;
    lVar6 = 0;
    do {
      bVar4 = (byte)iAbsLevel;
      pcVar2[lVar6 + iVar1] = bVar4 | 0x80;
      lVar6 = lVar6 + 1;
      bVar3 = 0x7f < (ulong)iAbsLevel;
      iAbsLevel = (ulong)iAbsLevel >> 7;
    } while (bVar3);
    pcVar2[lVar6 + (long)iVar1 + -1] = bVar4;
    iVar1 = pHint->n;
    iVar7 = (int)lVar6 + iVar1;
    pHint->n = iVar7;
    pcVar2 = pHint->a;
    lVar5 = 0;
    uVar9 = (long)nInput;
    do {
      lVar8 = lVar5;
      bVar4 = (byte)uVar9;
      pcVar2[lVar8 + iVar7] = bVar4 | 0x80;
      bVar3 = 0x7f < uVar9;
      lVar5 = lVar8 + 1;
      uVar9 = uVar9 >> 7;
    } while (bVar3);
    pcVar2[lVar8 + (iVar1 + (int)lVar6)] = bVar4;
    pHint->n = pHint->n + (int)(lVar8 + 1);
  }
  return;
}

Assistant:

static void fts3IncrmergeHintPush(
  Blob *pHint,                    /* Hint blob to append to */
  i64 iAbsLevel,                  /* First varint to store in hint */
  int nInput,                     /* Second varint to store in hint */
  int *pRc                        /* IN/OUT: Error code */
){
  blobGrowBuffer(pHint, pHint->n + 2*FTS3_VARINT_MAX, pRc);
  if( *pRc==SQLITE_OK ){
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], iAbsLevel);
    pHint->n += sqlite3Fts3PutVarint(&pHint->a[pHint->n], (i64)nInput);
  }
}